

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::removeNode(MemoryLeakDetectorTable *this,char *memory)

{
  unsigned_long uVar1;
  MemoryLeakDetectorNode *pMVar2;
  char *memory_local;
  MemoryLeakDetectorTable *this_local;
  
  uVar1 = hash(this,memory);
  pMVar2 = MemoryLeakDetectorList::removeNode(this->table_ + uVar1,memory);
  return pMVar2;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::removeNode(char* memory)
{
    return table_[hash(memory)].removeNode(memory);
}